

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableP<float>::VariableP
          (VariableP<float> *this,Variable<float> *ptr)

{
  Variable<float> *ptr_local;
  VariableP<float> *this_local;
  
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::SharedPtr
            (&this->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}